

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gru.cc
# Opt level: O2

void __thiscall
dynet::GRUBuilder::GRUBuilder
          (GRUBuilder *this,uint layers,uint input_dim,uint hidden_dim,ParameterCollection *model)

{
  uint uVar1;
  Parameter PVar2;
  Parameter PVar3;
  Parameter PVar4;
  Parameter PVar5;
  Parameter PVar6;
  Parameter PVar7;
  Parameter PVar8;
  Parameter PVar9;
  Parameter PVar10;
  ParameterCollection *this_00;
  initializer_list<unsigned_int> x;
  initializer_list<unsigned_int> x_00;
  initializer_list<unsigned_int> x_01;
  initializer_list<unsigned_int> x_02;
  initializer_list<unsigned_int> x_03;
  initializer_list<unsigned_int> x_04;
  initializer_list<unsigned_int> x_05;
  initializer_list<unsigned_int> x_06;
  initializer_list<unsigned_int> x_07;
  initializer_list<dynet::Parameter> __l;
  uint local_160;
  allocator local_159;
  ParameterInit local_158;
  undefined4 local_150;
  ParameterCollection *local_148;
  uint local_140;
  uint local_13c;
  _func_int **local_138;
  uint local_12c;
  vector<dynet::Parameter,_std::allocator<dynet::Parameter>_> ps;
  undefined1 local_d0 [160];
  
  (this->super_RNNBuilder).cur = -1;
  (this->super_RNNBuilder).sm.q_ = CREATED;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_RNNBuilder).head.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_RNNBuilder)._vptr_RNNBuilder = (_func_int **)&PTR__GRUBuilder_0070b2b0;
  this_00 = &this->local_model;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->params).
  super__Vector_base<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->param_vars).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_140 = input_dim;
  ParameterCollection::ParameterCollection(this_00);
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->h0).super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->h).
  super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->hidden_dim = hidden_dim;
  this->layers = layers;
  std::__cxx11::string::string((string *)&ps,"gru-builder",(allocator *)&local_158);
  ParameterCollection::add_subcollection((ParameterCollection *)local_d0,model,(string *)&ps);
  ParameterCollection::operator=(this_00,(ParameterCollection *)local_d0);
  ParameterCollection::~ParameterCollection((ParameterCollection *)local_d0);
  std::__cxx11::string::~string((string *)&ps);
  local_138 = (_func_int **)&PTR__ParameterInit_0070fae0;
  local_148 = this_00;
  local_13c = hidden_dim;
  while( true ) {
    x._M_array = &local_158;
    if (layers == 0) break;
    local_158._vptr_ParameterInit._4_4_ = local_140;
    local_158._vptr_ParameterInit._0_4_ = hidden_dim;
    x._M_len = 2;
    Dim::Dim((Dim *)local_d0,x);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_160);
    PVar2 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_158._vptr_ParameterInit._4_4_ = hidden_dim;
    x_00._M_len = 2;
    x_00._M_array = (iterator)&local_158;
    Dim::Dim((Dim *)local_d0,x_00);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_160);
    PVar3 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    x_01._M_len = 1;
    x_01._M_array = &local_160;
    local_160 = hidden_dim;
    Dim::Dim((Dim *)local_d0,x_01);
    local_158._vptr_ParameterInit = local_138;
    local_150 = 0;
    std::__cxx11::string::string((string *)&ps,"",&local_159);
    PVar4 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,&local_158,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_158._vptr_ParameterInit._4_4_ = local_140;
    x_02._M_len = 2;
    x_02._M_array = (iterator)&local_158;
    Dim::Dim((Dim *)local_d0,x_02);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_160);
    PVar5 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_158._vptr_ParameterInit._4_4_ = hidden_dim;
    x_03._M_len = 2;
    x_03._M_array = (iterator)&local_158;
    Dim::Dim((Dim *)local_d0,x_03);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_160);
    PVar6 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    x_04._M_len = 1;
    x_04._M_array = &local_160;
    local_160 = hidden_dim;
    Dim::Dim((Dim *)local_d0,x_04);
    local_158._vptr_ParameterInit = local_138;
    local_150 = 0;
    std::__cxx11::string::string((string *)&ps,"",&local_159);
    PVar7 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,&local_158,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_158._vptr_ParameterInit._4_4_ = local_140;
    x_05._M_len = 2;
    x_05._M_array = (iterator)&local_158;
    Dim::Dim((Dim *)local_d0,x_05);
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_160);
    PVar8 = ParameterCollection::add_parameters
                      (this_00,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_158._vptr_ParameterInit._4_4_ = local_13c;
    local_158._vptr_ParameterInit._0_4_ = local_13c;
    x_06._M_len = 2;
    x_06._M_array = (iterator)&local_158;
    Dim::Dim((Dim *)local_d0,x_06);
    local_12c = layers - 1;
    std::__cxx11::string::string((string *)&ps,"",(allocator *)&local_160);
    PVar9 = ParameterCollection::add_parameters
                      (local_148,(Dim *)local_d0,0.0,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    local_160 = local_13c;
    x_07._M_len = 1;
    x_07._M_array = &local_160;
    Dim::Dim((Dim *)local_d0,x_07);
    local_158._vptr_ParameterInit = local_138;
    local_150 = 0;
    std::__cxx11::string::string((string *)&ps,"",&local_159);
    PVar10 = ParameterCollection::add_parameters
                       (local_148,(Dim *)local_d0,&local_158,(string *)&ps,dynet::default_device);
    std::__cxx11::string::~string((string *)&ps);
    __l._M_len = 9;
    __l._M_array = (iterator)local_d0;
    local_d0._0_8_ = PVar2;
    local_d0._8_8_ = PVar3;
    local_d0._16_8_ = PVar4;
    local_d0._24_8_ = PVar5;
    local_d0._32_8_ = PVar6;
    local_d0._40_8_ = PVar7;
    local_d0._48_8_ = PVar8;
    local_d0._56_8_ = PVar9;
    local_d0._64_8_ = PVar10;
    std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>::vector
              (&ps,__l,(allocator_type *)&local_158);
    this_00 = local_148;
    std::
    vector<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>,_std::allocator<std::vector<dynet::Parameter,_std::allocator<dynet::Parameter>_>_>_>
    ::push_back(&this->params,(value_type *)&ps);
    layers = local_12c;
    hidden_dim = local_13c;
    uVar1 = local_13c;
    std::_Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_>::~_Vector_base
              ((_Vector_base<dynet::Parameter,_std::allocator<dynet::Parameter>_> *)&ps);
    local_140 = uVar1;
  }
  (this->super_RNNBuilder).dropout_rate = 0.0;
  return;
}

Assistant:

GRUBuilder::GRUBuilder(unsigned layers,
                       unsigned input_dim,
                       unsigned hidden_dim,
                       ParameterCollection& model) : hidden_dim(hidden_dim), layers(layers) {
  unsigned layer_input_dim = input_dim;
  local_model = model.add_subcollection("gru-builder");
  for (unsigned i = 0; i < layers; ++i) {
    // z
    Parameter p_x2z = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2z = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bz = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // r
    Parameter p_x2r = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2r = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_br = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    // h
    Parameter p_x2h = local_model.add_parameters({hidden_dim, layer_input_dim});
    Parameter p_h2h = local_model.add_parameters({hidden_dim, hidden_dim});
    Parameter p_bh = local_model.add_parameters({hidden_dim}, ParameterInitConst(0.f));

    layer_input_dim = hidden_dim;  // output (hidden) from 1st layer is input to next

    vector<Parameter> ps = {p_x2z, p_h2z, p_bz, p_x2r, p_h2r, p_br, p_x2h, p_h2h, p_bh};
    params.push_back(ps);
  }  // layers
  dropout_rate = 0.f;
}